

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_common.h
# Opt level: O1

int aom_get_qmlevel_luma_ssimulacra2(int qindex,int first,int last)

{
  uint uVar1;
  
  uVar1 = 10;
  if ((((0x28 < qindex) && (uVar1 = 9, 0x3c < qindex)) && (uVar1 = 8, 100 < qindex)) &&
     (((uVar1 = 7, 0x78 < qindex && (uVar1 = 6, 0x8c < qindex)) &&
      ((uVar1 = 5, 0xa0 < qindex && (uVar1 = 4, 200 < qindex)))))) {
    uVar1 = qindex < 0xdd | 2;
  }
  if ((int)uVar1 < last) {
    last = uVar1;
  }
  if ((int)uVar1 < first) {
    last = first;
  }
  return last;
}

Assistant:

static inline int aom_get_qmlevel_luma_ssimulacra2(int qindex, int first,
                                                   int last) {
  int qm_level = 0;

  if (qindex <= 40) {
    qm_level = 10;
  } else if (qindex <= 60) {
    qm_level = 9;
  } else if (qindex <= 100) {
    qm_level = 8;
  } else if (qindex <= 120) {
    qm_level = 7;
  } else if (qindex <= 140) {
    qm_level = 6;
  } else if (qindex <= 160) {
    qm_level = 5;
  } else if (qindex <= 200) {
    qm_level = 4;
  } else if (qindex <= 220) {
    qm_level = 3;
  } else {
    qm_level = 2;
  }

  return clamp(qm_level, first, last);
}